

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_iMultiFab.cpp
# Opt level: O0

void __thiscall
amrex::iMultiFab::plus(iMultiFab *this,iMultiFab *mf,int strt_comp,int num_comp,int nghost)

{
  undefined8 in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  undefined4 in_stack_00000008;
  
  Add<amrex::IArrayBox,void>
            ((FabArray<amrex::IArrayBox> *)CONCAT44(strt_comp,num_comp),
             (FabArray<amrex::IArrayBox> *)CONCAT44(nghost,in_stack_00000008),unaff_retaddr_00,
             unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  return;
}

Assistant:

void
iMultiFab::plus (const iMultiFab& mf,
                int             strt_comp,
                int             num_comp,
                int             nghost)
{
    BL_ASSERT(boxarray == mf.boxarray);
    BL_ASSERT(strt_comp >= 0);
    BL_ASSERT(num_comp > 0);
    BL_ASSERT(strt_comp + num_comp - 1 < n_comp && strt_comp + num_comp - 1 < mf.n_comp);
    BL_ASSERT(nghost <= n_grow.min() && nghost <= mf.n_grow.min());

    amrex::Add(*this, mf, strt_comp, strt_comp, num_comp, nghost);
}